

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_set_i32(ggml_tensor *tensor,int32_t value)

{
  uint uVar1;
  size_t sVar2;
  undefined1 auVar3 [32];
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined2 uVar7;
  ulong uVar8;
  long lVar9;
  void *__s;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar12 [32];
  undefined1 auVar14 [32];
  
  if (tensor->type < 8) {
    uVar4 = tensor->ne[2] * tensor->ne[1] * tensor->ne[3];
    uVar1 = tensor->ne[0];
    uVar6 = (ulong)uVar1;
    sVar2 = tensor->nb[1];
    __s = tensor->data;
    auVar21 = in_ZMM5._0_32_;
    auVar22 = in_ZMM6._0_16_;
    auVar28 = in_ZMM9._0_32_;
    uVar7 = (undefined2)value;
    switch(tensor->type) {
    case GGML_TYPE_Q4_0:
      ggml_set_i32_cold_3();
    case GGML_TYPE_Q4_1:
      ggml_set_i32_cold_2();
    case GGML_TYPE_COUNT:
      ggml_set_i32_cold_1();
    case GGML_TYPE_I8:
      if (0 < (int)uVar4) {
        uVar8 = (ulong)uVar4;
        do {
          if (0 < (int)uVar1) {
            memset(__s,value & 0xff,uVar6);
          }
          __s = (void *)((long)__s + sVar2);
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      break;
    case GGML_TYPE_I16:
      if (0 < (int)uVar4) {
        lVar5 = uVar6 - 1;
        auVar10._8_8_ = lVar5;
        auVar10._0_8_ = lVar5;
        auVar12._16_8_ = lVar5;
        auVar12._0_16_ = auVar10;
        auVar12._24_8_ = lVar5;
        lVar5 = (long)__s + 0x1e;
        uVar6 = 0;
        auVar3 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
        auVar25 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
        auVar15 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar17 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar19._8_8_ = 0x8000000000000000;
        auVar19._0_8_ = 0x8000000000000000;
        auVar22 = vpcmpeqd_avx(auVar22,auVar22);
        auVar26._8_8_ = 0x8000000000000000;
        auVar26._0_8_ = 0x8000000000000000;
        auVar26._16_8_ = 0x8000000000000000;
        auVar26._24_8_ = 0x8000000000000000;
        auVar23 = auVar12 ^ auVar26;
        auVar21 = vpcmpeqd_avx2(auVar28,auVar28);
        do {
          if (0 < (int)uVar1) {
            lVar9 = 0;
            auVar28 = auVar17;
            auVar14 = auVar15;
            auVar27 = auVar25;
            auVar13 = auVar3;
            do {
              auVar11 = vpcmpgtq_avx(auVar28._0_16_ ^ auVar19,auVar10 ^ auVar19);
              auVar11 = vpackssdw_avx(auVar11,auVar11);
              auVar11 = vpackssdw_avx(auVar11 ^ auVar22,auVar11 ^ auVar22);
              auVar11 = vpacksswb_avx(auVar11,auVar11);
              if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x1e + lVar9) = uVar7;
              }
              auVar11 = vpcmpgtq_avx(auVar28._0_16_ ^ auVar19,auVar10 ^ auVar19);
              auVar11 = vpackssdw_avx(auVar11,auVar11);
              auVar11 = vpackssdw_avx(auVar11 ^ auVar22,auVar11 ^ auVar22);
              auVar11 = vpacksswb_avx(auVar11,auVar11);
              if ((auVar11 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x1c + lVar9) = uVar7;
              }
              auVar16 = vpcmpgtq_avx2(auVar28 ^ auVar26,auVar23);
              auVar18 = vpshuflw_avx2(auVar16,0xe8);
              auVar31._0_4_ = auVar18._16_4_;
              auVar31._4_4_ = auVar31._0_4_;
              auVar31._8_4_ = auVar31._0_4_;
              auVar31._12_4_ = auVar31._0_4_;
              auVar11 = vpackssdw_avx(auVar31 ^ auVar22,auVar31 ^ auVar22);
              auVar11 = vpacksswb_avx(auVar11,auVar11);
              if ((auVar11 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x1a + lVar9) = uVar7;
              }
              auVar11 = vpackssdw_avx(auVar16._16_16_,auVar16._16_16_);
              auVar11 = vpackssdw_avx(auVar11 ^ auVar22,auVar11 ^ auVar22);
              auVar11 = vpacksswb_avx(auVar11,auVar11);
              if ((auVar11 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x18 + lVar9) = uVar7;
              }
              auVar11 = vpcmpgtq_avx(auVar14._0_16_ ^ auVar19,auVar10 ^ auVar19);
              auVar11 = vpackssdw_avx(auVar11,auVar11);
              auVar16 = vpermq_avx2(ZEXT1632(auVar11 ^ auVar22),0x55);
              auVar16 = vpackssdw_avx2(auVar16,auVar12);
              auVar11 = vpacksswb_avx(auVar16._16_16_,auVar16._16_16_);
              if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x16 + lVar9) = uVar7;
              }
              auVar11 = vpcmpgtq_avx(auVar14._0_16_ ^ auVar19,auVar10 ^ auVar19);
              auVar11 = vpshufhw_avx(auVar11,0x84);
              auVar16 = vpermq_avx2(ZEXT1632(auVar11 ^ auVar22),0x55);
              auVar16 = vpackssdw_avx2(auVar16,auVar12);
              auVar11 = vpacksswb_avx(auVar16._16_16_,auVar16._16_16_);
              if ((auVar11 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x14 + lVar9) = uVar7;
              }
              auVar18 = vpcmpgtq_avx2(auVar14 ^ auVar26,auVar23);
              auVar16 = vpackssdw_avx2(auVar12,auVar18);
              auVar16 = vpackssdw_avx2(auVar16 ^ auVar21,auVar12);
              auVar11 = vpacksswb_avx(auVar16._16_16_,auVar16._16_16_);
              if ((auVar11 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x12 + lVar9) = uVar7;
              }
              auVar16 = vpackssdw_avx2(auVar12,auVar18);
              auVar16 = vpackssdw_avx2(auVar16 ^ auVar21,auVar12);
              auVar11 = vpacksswb_avx(auVar16._16_16_,auVar16._16_16_);
              if ((auVar11 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x10 + lVar9) = uVar7;
              }
              auVar11 = vpcmpgtq_avx(auVar27._0_16_ ^ auVar19,auVar10 ^ auVar19);
              auVar11 = vpackssdw_avx(auVar11,auVar11);
              auVar11 = vpackssdw_avx(auVar11 ^ auVar22,auVar11 ^ auVar22);
              auVar11 = vpacksswb_avx(auVar11,auVar11);
              if ((auVar11 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0xe + lVar9) = uVar7;
              }
              auVar11 = vpcmpgtq_avx(auVar27._0_16_ ^ auVar19,auVar10 ^ auVar19);
              auVar11 = vpackssdw_avx(auVar11,auVar11);
              auVar11 = vpackssdw_avx(auVar11 ^ auVar22,auVar11 ^ auVar22);
              auVar11 = vpacksswb_avx(auVar11,auVar11);
              if ((auVar11 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0xc + lVar9) = uVar7;
              }
              auVar16 = vpcmpgtq_avx2(auVar27 ^ auVar26,auVar23);
              auVar18 = vpshuflw_avx2(auVar16,0xe8);
              auVar32._0_4_ = auVar18._16_4_;
              auVar32._4_4_ = auVar32._0_4_;
              auVar32._8_4_ = auVar32._0_4_;
              auVar32._12_4_ = auVar32._0_4_;
              auVar11 = vpackssdw_avx(auVar32 ^ auVar22,auVar32 ^ auVar22);
              auVar11 = vpacksswb_avx(auVar11,auVar11);
              if ((auVar11 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -10 + lVar9) = uVar7;
              }
              auVar11 = vpackssdw_avx(auVar16._16_16_,auVar16._16_16_);
              auVar11 = vpackssdw_avx(auVar11 ^ auVar22,auVar11 ^ auVar22);
              auVar11 = vpacksswb_avx(auVar11,auVar11);
              if ((auVar11 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -8 + lVar9) = uVar7;
              }
              auVar11 = vpcmpgtq_avx(auVar13._0_16_ ^ auVar19,auVar10 ^ auVar19);
              auVar11 = vpackssdw_avx(auVar11,auVar11);
              auVar16 = vpermq_avx2(ZEXT1632(auVar11 ^ auVar22),0x55);
              auVar16 = vpackssdw_avx2(auVar12,auVar16);
              auVar11 = vpacksswb_avx(auVar16._16_16_,auVar16._16_16_);
              if ((auVar11 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -6 + lVar9) = uVar7;
              }
              auVar11 = vpcmpgtq_avx(auVar13._0_16_ ^ auVar19,auVar10 ^ auVar19);
              auVar11 = vpshufhw_avx(auVar11,0x84);
              auVar16 = vpermq_avx2(ZEXT1632(auVar11 ^ auVar22),0x55);
              auVar16 = vpackssdw_avx2(auVar12,auVar16);
              auVar11 = vpacksswb_avx(auVar16._16_16_,auVar16._16_16_);
              if ((auVar11 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -4 + lVar9) = uVar7;
              }
              auVar18 = vpcmpgtq_avx2(auVar13 ^ auVar26,auVar23);
              auVar16 = vpackssdw_avx2(auVar12,auVar18);
              auVar16 = vpackssdw_avx2(auVar12,auVar16 ^ auVar21);
              auVar11 = vpacksswb_avx(auVar16._16_16_,auVar16._16_16_);
              if ((auVar11 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -2 + lVar9) = uVar7;
              }
              auVar16 = vpackssdw_avx2(auVar12,auVar18);
              auVar16 = vpackssdw_avx2(auVar12,auVar16 ^ auVar21);
              auVar11 = vpacksswb_avx(auVar16._16_16_,auVar16._16_16_);
              if ((auVar11 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + lVar9) = uVar7;
              }
              auVar29._8_8_ = 0x10;
              auVar29._0_8_ = 0x10;
              auVar29._16_8_ = 0x10;
              auVar29._24_8_ = 0x10;
              auVar28 = vpaddq_avx2(auVar28,auVar29);
              auVar14 = vpaddq_avx2(auVar14,auVar29);
              auVar27 = vpaddq_avx2(auVar27,auVar29);
              auVar13 = vpaddq_avx2(auVar13,auVar29);
              lVar9 = lVar9 + 0x20;
            } while ((ulong)(uVar1 + 0xf >> 4) << 5 != lVar9);
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + sVar2;
        } while (uVar6 != uVar4);
      }
      break;
    case GGML_TYPE_I32:
      if (0 < (int)uVar4) {
        lVar5 = uVar6 - 1;
        auVar18._8_8_ = lVar5;
        auVar18._0_8_ = lVar5;
        auVar18._16_8_ = lVar5;
        auVar18._24_8_ = lVar5;
        auVar13._4_4_ = value;
        auVar13._0_4_ = value;
        auVar13._8_4_ = value;
        auVar13._12_4_ = value;
        auVar13._16_4_ = value;
        auVar13._20_4_ = value;
        auVar13._24_4_ = value;
        auVar13._28_4_ = value;
        uVar6 = 0;
        auVar28 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar3 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar16._8_8_ = 0x8000000000000000;
        auVar16._0_8_ = 0x8000000000000000;
        auVar16._16_8_ = 0x8000000000000000;
        auVar16._24_8_ = 0x8000000000000000;
        auVar21 = vpcmpeqd_avx2(auVar21,auVar21);
        do {
          if (0 < (int)uVar1) {
            uVar8 = 0;
            do {
              auVar24._8_8_ = uVar8;
              auVar24._0_8_ = uVar8;
              auVar24._16_8_ = uVar8;
              auVar24._24_8_ = uVar8;
              auVar15 = vpor_avx2(auVar24,auVar28);
              auVar25 = vpor_avx2(auVar24,auVar3);
              auVar25 = vpcmpgtq_avx2(auVar25 ^ auVar16,auVar18 ^ auVar16);
              auVar15 = vpcmpgtq_avx2(auVar15 ^ auVar16,auVar18 ^ auVar16);
              auVar25 = vpackssdw_avx2(auVar15,auVar25);
              auVar22 = vpackssdw_avx(SUB3216(auVar25 ^ auVar21,0),SUB3216(auVar25 ^ auVar21,0x10));
              auVar22 = vpshufd_avx(auVar22,0xd8);
              auVar25 = vpmovzxwd_avx2(auVar22);
              auVar25 = vpslld_avx2(auVar25,0x1f);
              auVar25 = vpmaskmovd_avx2(auVar25,auVar13);
              *(undefined1 (*) [32])((long)__s + uVar8 * 4) = auVar25;
              uVar8 = uVar8 + 8;
            } while ((uVar1 + 7 & 0xfffffff8) != uVar8);
          }
          uVar6 = uVar6 + 1;
          __s = (void *)((long)__s + sVar2);
        } while (uVar6 != uVar4);
      }
      break;
    case GGML_TYPE_F16:
      if (0 < (int)uVar4) {
        lVar5 = uVar6 - 1;
        auVar11._8_8_ = lVar5;
        auVar11._0_8_ = lVar5;
        auVar14._16_8_ = lVar5;
        auVar14._0_16_ = auVar11;
        auVar14._24_8_ = lVar5;
        lVar5 = (long)__s + 0x1e;
        uVar6 = 0;
        auVar3 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
        auVar25 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
        auVar15 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar17 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar20._8_8_ = 0x8000000000000000;
        auVar20._0_8_ = 0x8000000000000000;
        auVar22 = vpcmpeqd_avx(auVar22,auVar22);
        auVar27._8_8_ = 0x8000000000000000;
        auVar27._0_8_ = 0x8000000000000000;
        auVar27._16_8_ = 0x8000000000000000;
        auVar27._24_8_ = 0x8000000000000000;
        auVar23 = auVar14 ^ auVar27;
        auVar21 = vpcmpeqd_avx2(auVar28,auVar28);
        do {
          if (0 < (int)uVar1) {
            lVar9 = 0;
            auVar28 = auVar17;
            auVar13 = auVar15;
            auVar16 = auVar25;
            auVar18 = auVar3;
            do {
              auVar33 = vpcmpgtq_avx(auVar28._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar33 = vpackssdw_avx(auVar33,auVar33);
              auVar33 = vpackssdw_avx(auVar33 ^ auVar22,auVar33 ^ auVar22);
              auVar33 = vpacksswb_avx(auVar33,auVar33);
              if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x1e + lVar9) = uVar7;
              }
              auVar33 = vpcmpgtq_avx(auVar28._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar33 = vpackssdw_avx(auVar33,auVar33);
              auVar33 = vpackssdw_avx(auVar33 ^ auVar22,auVar33 ^ auVar22);
              auVar33 = vpacksswb_avx(auVar33,auVar33);
              if ((auVar33 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x1c + lVar9) = uVar7;
              }
              auVar30 = vpcmpgtq_avx2(auVar28 ^ auVar27,auVar23);
              auVar24 = vpshuflw_avx2(auVar30,0xe8);
              auVar33._0_4_ = auVar24._16_4_;
              auVar33._4_4_ = auVar33._0_4_;
              auVar33._8_4_ = auVar33._0_4_;
              auVar33._12_4_ = auVar33._0_4_;
              auVar33 = vpackssdw_avx(auVar33 ^ auVar22,auVar33 ^ auVar22);
              auVar33 = vpacksswb_avx(auVar33,auVar33);
              if ((auVar33 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x1a + lVar9) = uVar7;
              }
              auVar33 = vpackssdw_avx(auVar30._16_16_,auVar30._16_16_);
              auVar33 = vpackssdw_avx(auVar33 ^ auVar22,auVar33 ^ auVar22);
              auVar33 = vpacksswb_avx(auVar33,auVar33);
              if ((auVar33 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x18 + lVar9) = uVar7;
              }
              auVar33 = vpcmpgtq_avx(auVar13._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar33 = vpackssdw_avx(auVar33,auVar33);
              auVar30 = vpermq_avx2(ZEXT1632(auVar33 ^ auVar22),0x55);
              auVar30 = vpackssdw_avx2(auVar30,auVar14);
              auVar33 = vpacksswb_avx(auVar30._16_16_,auVar30._16_16_);
              if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x16 + lVar9) = uVar7;
              }
              auVar33 = vpcmpgtq_avx(auVar13._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar33 = vpshufhw_avx(auVar33,0x84);
              auVar30 = vpermq_avx2(ZEXT1632(auVar33 ^ auVar22),0x55);
              auVar30 = vpackssdw_avx2(auVar30,auVar14);
              auVar33 = vpacksswb_avx(auVar30._16_16_,auVar30._16_16_);
              if ((auVar33 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x14 + lVar9) = uVar7;
              }
              auVar24 = vpcmpgtq_avx2(auVar13 ^ auVar27,auVar23);
              auVar30 = vpackssdw_avx2(auVar14,auVar24);
              auVar30 = vpackssdw_avx2(auVar30 ^ auVar21,auVar14);
              auVar33 = vpacksswb_avx(auVar30._16_16_,auVar30._16_16_);
              if ((auVar33 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x12 + lVar9) = uVar7;
              }
              auVar30 = vpackssdw_avx2(auVar14,auVar24);
              auVar30 = vpackssdw_avx2(auVar30 ^ auVar21,auVar14);
              auVar33 = vpacksswb_avx(auVar30._16_16_,auVar30._16_16_);
              if ((auVar33 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0x10 + lVar9) = uVar7;
              }
              auVar33 = vpcmpgtq_avx(auVar16._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar33 = vpackssdw_avx(auVar33,auVar33);
              auVar33 = vpackssdw_avx(auVar33 ^ auVar22,auVar33 ^ auVar22);
              auVar33 = vpacksswb_avx(auVar33,auVar33);
              if ((auVar33 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0xe + lVar9) = uVar7;
              }
              auVar33 = vpcmpgtq_avx(auVar16._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar33 = vpackssdw_avx(auVar33,auVar33);
              auVar33 = vpackssdw_avx(auVar33 ^ auVar22,auVar33 ^ auVar22);
              auVar33 = vpacksswb_avx(auVar33,auVar33);
              if ((auVar33 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -0xc + lVar9) = uVar7;
              }
              auVar30 = vpcmpgtq_avx2(auVar16 ^ auVar27,auVar23);
              auVar24 = vpshuflw_avx2(auVar30,0xe8);
              auVar34._0_4_ = auVar24._16_4_;
              auVar34._4_4_ = auVar34._0_4_;
              auVar34._8_4_ = auVar34._0_4_;
              auVar34._12_4_ = auVar34._0_4_;
              auVar33 = vpackssdw_avx(auVar34 ^ auVar22,auVar34 ^ auVar22);
              auVar33 = vpacksswb_avx(auVar33,auVar33);
              if ((auVar33 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -10 + lVar9) = uVar7;
              }
              auVar33 = vpackssdw_avx(auVar30._16_16_,auVar30._16_16_);
              auVar33 = vpackssdw_avx(auVar33 ^ auVar22,auVar33 ^ auVar22);
              auVar33 = vpacksswb_avx(auVar33,auVar33);
              if ((auVar33 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -8 + lVar9) = uVar7;
              }
              auVar33 = vpcmpgtq_avx(auVar18._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar33 = vpackssdw_avx(auVar33,auVar33);
              auVar30 = vpermq_avx2(ZEXT1632(auVar33 ^ auVar22),0x55);
              auVar30 = vpackssdw_avx2(auVar14,auVar30);
              auVar33 = vpacksswb_avx(auVar30._16_16_,auVar30._16_16_);
              if ((auVar33 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -6 + lVar9) = uVar7;
              }
              auVar33 = vpcmpgtq_avx(auVar18._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar33 = vpshufhw_avx(auVar33,0x84);
              auVar30 = vpermq_avx2(ZEXT1632(auVar33 ^ auVar22),0x55);
              auVar30 = vpackssdw_avx2(auVar14,auVar30);
              auVar33 = vpacksswb_avx(auVar30._16_16_,auVar30._16_16_);
              if ((auVar33 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -4 + lVar9) = uVar7;
              }
              auVar24 = vpcmpgtq_avx2(auVar18 ^ auVar27,auVar23);
              auVar30 = vpackssdw_avx2(auVar14,auVar24);
              auVar30 = vpackssdw_avx2(auVar14,auVar30 ^ auVar21);
              auVar33 = vpacksswb_avx(auVar30._16_16_,auVar30._16_16_);
              if ((auVar33 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + -2 + lVar9) = uVar7;
              }
              auVar30 = vpackssdw_avx2(auVar14,auVar24);
              auVar30 = vpackssdw_avx2(auVar14,auVar30 ^ auVar21);
              auVar33 = vpacksswb_avx(auVar30._16_16_,auVar30._16_16_);
              if ((auVar33 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar5 + lVar9) = uVar7;
              }
              auVar30._8_8_ = 0x10;
              auVar30._0_8_ = 0x10;
              auVar30._16_8_ = 0x10;
              auVar30._24_8_ = 0x10;
              auVar28 = vpaddq_avx2(auVar28,auVar30);
              auVar13 = vpaddq_avx2(auVar13,auVar30);
              auVar16 = vpaddq_avx2(auVar16,auVar30);
              auVar18 = vpaddq_avx2(auVar18,auVar30);
              lVar9 = lVar9 + 0x20;
            } while ((ulong)(uVar1 + 0xf >> 4) << 5 != lVar9);
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + sVar2;
        } while (uVar6 != uVar4);
      }
      break;
    case GGML_TYPE_F32:
      if (0 < (int)uVar4) {
        auVar25._0_4_ = (float)value;
        lVar5 = uVar6 - 1;
        auVar17._8_8_ = lVar5;
        auVar17._0_8_ = lVar5;
        auVar17._16_8_ = lVar5;
        auVar17._24_8_ = lVar5;
        auVar25._4_4_ = auVar25._0_4_;
        auVar25._8_4_ = auVar25._0_4_;
        auVar25._12_4_ = auVar25._0_4_;
        auVar25._16_4_ = auVar25._0_4_;
        auVar25._20_4_ = auVar25._0_4_;
        auVar25._24_4_ = auVar25._0_4_;
        auVar25._28_4_ = auVar25._0_4_;
        uVar6 = 0;
        auVar28 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar3 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar15._8_8_ = 0x8000000000000000;
        auVar15._0_8_ = 0x8000000000000000;
        auVar15._16_8_ = 0x8000000000000000;
        auVar15._24_8_ = 0x8000000000000000;
        auVar21 = vpcmpeqd_avx2(auVar21,auVar21);
        do {
          if (0 < (int)uVar1) {
            uVar8 = 0;
            do {
              auVar23._8_8_ = uVar8;
              auVar23._0_8_ = uVar8;
              auVar23._16_8_ = uVar8;
              auVar23._24_8_ = uVar8;
              auVar14 = vpor_avx2(auVar23,auVar28);
              auVar23 = vpor_avx2(auVar23,auVar3);
              auVar23 = vpcmpgtq_avx2(auVar23 ^ auVar15,auVar17 ^ auVar15);
              auVar14 = vpcmpgtq_avx2(auVar14 ^ auVar15,auVar17 ^ auVar15);
              auVar23 = vpackssdw_avx2(auVar14,auVar23);
              auVar22 = vpackssdw_avx(SUB3216(auVar23 ^ auVar21,0),SUB3216(auVar23 ^ auVar21,0x10));
              auVar22 = vpshufd_avx(auVar22,0xd8);
              auVar23 = vpmovzxwd_avx2(auVar22);
              auVar23 = vpslld_avx2(auVar23,0x1f);
              auVar23 = vmaskmovps_avx(auVar23,auVar25);
              *(undefined1 (*) [32])((long)__s + uVar8 * 4) = auVar23;
              uVar8 = uVar8 + 8;
            } while ((uVar1 + 7 & 0xfffffff8) != uVar8);
          }
          uVar6 = uVar6 + 1;
          __s = (void *)((long)__s + sVar2);
        } while (uVar6 != uVar4);
      }
    }
  }
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_i32 (struct ggml_tensor * tensor, int32_t value) {
    const int n     = ggml_nrows(tensor);
    const int nc    = tensor->ne[0];
    const size_t n1 = tensor->nb[1];

    char * const data = tensor->data;

    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                assert(tensor->nb[0] == sizeof(int8_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i8(nc, (int8_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I16:
            {
                assert(tensor->nb[0] == sizeof(int16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i16(nc, (int16_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I32:
            {
                assert(tensor->nb[0] == sizeof(int32_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i32(nc, (int32_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_F16:
            {
                assert(tensor->nb[0] == sizeof(ggml_fp16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f16(nc, (ggml_fp16_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_F32:
            {
                assert(tensor->nb[0] == sizeof(float));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f32(nc, (float *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }

    return tensor;
}